

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::addOptionHelp
          (QPDFArgParser *this,string *option_name,string *topic,string *short_text,
          string *long_text)

{
  element_type *peVar1;
  char *pcVar2;
  size_type sVar3;
  iterator iVar4;
  mapped_type *this_00;
  mapped_type *pmVar5;
  logic_error *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  HelpTopic local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (2 < option_name->_M_string_length) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)option_name);
    if (*pcVar2 == '-') {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)option_name);
      if (*pcVar2 == '-') {
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                ::count(&((this->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->option_help,option_name);
        if (sVar3 != 0) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_e0,"QPDFArgParser: option ",option_name);
          std::operator+(&local_c0.short_text,&local_e0," already has help");
          std::logic_error::logic_error(plVar6,(string *)&local_c0);
          __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                ::find(&(((this->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->help_topics)._M_t,topic);
        if (iVar4._M_node !=
            &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header) {
          HelpTopic::HelpTopic(&local_c0,short_text,long_text);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                    ::operator[](&((this->m).
                                   super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->option_help,option_name);
          HelpTopic::operator=(this_00,&local_c0);
          HelpTopic::~HelpTopic(&local_c0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(iVar4._M_node + 4),option_name);
          peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"help",(allocator<char> *)&local_e0);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                   ::operator[](&peVar1->help_option_table,&local_c0.short_text);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&pmVar5->choices,option_name);
          std::__cxx11::string::~string((string *)&local_c0);
          return;
        }
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"QPDFArgParser: unable to add option ",option_name);
        std::operator+(&local_e0,&local_50," to unknown help topic ");
        std::operator+(&local_c0.short_text,&local_e0,topic);
        std::logic_error::logic_error(plVar6,(string *)&local_c0);
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar6,"QPDFArgParser: options for help must start with --");
  __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addOptionHelp(
    std::string const& option_name,
    std::string const& topic,
    std::string const& short_text,
    std::string const& long_text)
{
    if (!((option_name.length() > 2) && (option_name.at(0) == '-') && (option_name.at(1) == '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad option for help");
        throw std::logic_error("QPDFArgParser: options for help must start with --");
    }
    if (m->option_help.count(option_name)) {
        QTC::TC("libtests", "QPDFArgParser duplicate option help");
        throw std::logic_error("QPDFArgParser: option " + option_name + " already has help");
    }
    auto ht = m->help_topics.find(topic);
    if (ht == m->help_topics.end()) {
        QTC::TC("libtests", "QPDFArgParser add to unknown topic");
        throw std::logic_error(
            "QPDFArgParser: unable to add option " + option_name + " to unknown help topic " +
            topic);
    }
    m->option_help[option_name] = HelpTopic(short_text, long_text);
    ht->second.options.insert(option_name);
    m->help_option_table["help"].choices.insert(option_name);
}